

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__reader.cc
# Opt level: O2

void __thiscall
xemmai::io::t_reader::t_reader
          (t_reader *this,t_pvalue *a_stream,wstring_view a_encoding,size_t a_buffer)

{
  t_object *ptVar1;
  t_queue<128UL> *ptVar2;
  t_queue<256UL> *ptVar3;
  wstring_view a_string;
  t_object *ptVar4;
  size_t unaff_R12;
  wchar_t *unaff_R13;
  long in_FS_OFFSET;
  char *local_48 [4];
  
  (this->super_t_sharable).super_t_owned.v_owner = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x30) = 0;
  a_string._M_str = unaff_R13;
  a_string._M_len = unaff_R12;
  portable::f_convert_abi_cxx11_(a_string);
  portable::t_iconv::t_iconv(&this->super_t_iconv,"wchar_t",local_48[0]);
  std::__cxx11::string::~string((string *)local_48);
  this->v_n0 = 0;
  (this->v_stream).v_p._M_b._M_p = (__pointer_type)0x0;
  (this->v_buffer).v_p._M_b._M_p = (__pointer_type)0x0;
  this->v_p1 = (char *)&this->v_c;
  this->v_n1 = 4;
  ptVar4 = (a_stream->super_t_pointer).v_p;
  if ((t_object *)0x4 < ptVar4) {
    ptVar2 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *ptVar2->v_head = ptVar4;
    if (ptVar2->v_head == ptVar2->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar2);
    }
    else {
      ptVar2->v_head = ptVar2->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (this->v_stream).v_p._M_b._M_p;
  (this->v_stream).v_p._M_b._M_p = ptVar4;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    ptVar3 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *ptVar3->v_head = ptVar1;
    if (ptVar3->v_head == ptVar3->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar3);
    }
    else {
      ptVar3->v_head = ptVar3->v_head + 1;
    }
  }
  ptVar4 = t_bytes::f_instantiate(a_buffer + (a_buffer == 0));
  if ((t_object *)0x4 < ptVar4) {
    ptVar2 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *ptVar2->v_head = ptVar4;
    if (ptVar2->v_head == ptVar2->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar2);
    }
    else {
      ptVar2->v_head = ptVar2->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (this->v_buffer).v_p._M_b._M_p;
  (this->v_buffer).v_p._M_b._M_p = ptVar4;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    ptVar3 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *ptVar3->v_head = ptVar1;
    if (ptVar3->v_head == ptVar3->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar3);
    }
    else {
      ptVar3->v_head = ptVar3->v_head + 1;
    }
  }
  return;
}

Assistant:

t_reader::t_reader(const t_pvalue& a_stream, std::wstring_view a_encoding, size_t a_buffer) : t_iconv("wchar_t", portable::f_convert(a_encoding).c_str())
{
	v_stream = a_stream;
	v_buffer = t_bytes::f_instantiate(std::max(a_buffer, size_t(1)));
}